

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cscript.c
# Opt level: O1

int envy_bios_parse_bit_2(envy_bios *bios,envy_bios_bit_entry *bit)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  (bios->i2cscript).bit = bit;
  uVar1 = bit->t_len;
  if (uVar1 < 4) {
    fprintf(_stderr,"I2C script table too short: %d < %d\n",(ulong)uVar1,4);
    iVar2 = -0x16;
  }
  else {
    if (uVar1 != 4) {
      fprintf(_stderr,"I2C script table longer than expected: %d > %d\n",(ulong)uVar1,4);
    }
    lVar3 = (ulong)bit->t_offset + 1;
    if ((uint)lVar3 < bios->length) {
      (bios->i2cscript).unk00 = CONCAT11(bios->data[lVar3],bios->data[bit->t_offset]);
      iVar5 = 0;
    }
    else {
      (bios->i2cscript).unk00 = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      iVar5 = -0xe;
    }
    lVar3 = (ulong)bit->t_offset + 3;
    if ((uint)lVar3 < bios->length) {
      (bios->i2cscript).script = CONCAT11(bios->data[lVar3],bios->data[(ulong)bit->t_offset + 2]);
      iVar4 = 0;
    }
    else {
      (bios->i2cscript).script = 0;
      fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
      iVar4 = -0xe;
    }
    iVar2 = -0xe;
    if (iVar4 == 0 && iVar5 == 0) {
      (bios->i2cscript).valid = '\x01';
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_bit_2 (struct envy_bios *bios, struct envy_bios_bit_entry *bit) {
	struct envy_bios_i2cscript *i2cscript = &bios->i2cscript;
	i2cscript->bit = bit;
	int wantlen = 4;
	if (bit->t_len < wantlen) {
		ENVY_BIOS_ERR("I2C script table too short: %d < %d\n", bit->t_len, wantlen);
		return -EINVAL;
	}
	if (bit->t_len > wantlen)
		ENVY_BIOS_WARN("I2C script table longer than expected: %d > %d\n", bit->t_len, wantlen);
	int err = 0;
	err |= bios_u16(bios, bit->t_offset+0, &i2cscript->unk00);
	err |= bios_u16(bios, bit->t_offset+2, &i2cscript->script);
	if (err)
		return -EFAULT;
	i2cscript->valid = 1;
	return 0;
}